

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O1

int main(void)

{
  sqlite3_stmt *psVar1;
  pointer pcVar2;
  undefined8 uVar3;
  sqlite3 *psVar4;
  undefined1 auVar5 [8];
  dynrow_iterator dVar6;
  bool bVar7;
  int iVar8;
  undefined4 uVar9;
  ostream *poVar10;
  statement *psVar11;
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pqVar12;
  row_type *prVar13;
  dynquery *pdVar14;
  char *__function;
  size_t sVar15;
  long *plVar16;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *row;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar17;
  long lVar18;
  int i;
  initializer_list<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  dynrow dVar19;
  database db1_12;
  database db1;
  database db1_1;
  database db1_3;
  query<int> add1;
  database db1_6;
  query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> add2;
  dynrow_iterator __begin1_1;
  statement inserter_assign;
  database local_320;
  undefined1 local_318 [16];
  undefined1 local_308 [32];
  undefined1 local_2e8 [8];
  _Alloc_hider _Stack_2e0;
  undefined1 local_2d8 [8];
  undefined1 local_2d0 [24];
  _Alloc_hider local_2b8;
  size_type local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  _Head_base<0UL,_int,_false> local_298;
  bool local_290;
  statement_base local_288;
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248 [2];
  undefined8 local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Head_base<0UL,_int,_false> local_208;
  bool local_200;
  dynrow local_1f8;
  undefined1 local_1e8 [8];
  _Alloc_hider local_1e0;
  undefined1 local_1d8 [32];
  undefined8 local_1b8;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1a8;
  _Head_base<0UL,_int,_false> local_198;
  long *local_190 [2];
  long local_180;
  ios_base local_178 [264];
  dynrow_iterator local_70;
  statement_base local_68;
  
  sqlite3_open(":memory:",local_318);
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"select ?1+?2","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_258,(database *)local_318,(string *)local_1e8);
  local_228 = (pointer)((ulong)local_228._5_3_ << 0x28);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  local_1e8._0_4_ = 3;
  local_2e8._0_4_ = 4;
  sqlib::query<int>::operator()((query<int> *)local_258,(int *)local_1e8,(int *)local_2e8);
  if (local_228._4_1_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_1e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_1e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(add1) == true",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_228._4_1_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_1e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_1e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(add1)",0xe);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if ((_Head_base<0UL,_int,_false>)local_228._0_4_ != (_Head_base<0UL,_int,_false>)0x7) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_1e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_1e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*add1) == 7",0x17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::query<int>::operator++((query<int> *)local_258);
  local_2e8 = (undefined1  [8])local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"select ?1+?2","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_1e8,(database *)local_318,(string *)local_2e8);
  uStack_1b0 = 0;
  uStack_1ac = 0;
  aStack_1a8._M_allocated_capacity._0_4_ = aStack_1a8._M_allocated_capacity._0_4_ & 0xffffff00;
  local_198._M_head_impl = local_198._M_head_impl & 0xffffff00;
  local_1b8 = (pointer)&aStack_1a8;
  if (local_2e8 != (undefined1  [8])local_2d8) {
    operator_delete((void *)local_2e8,(ulong)((long)local_2d8 + 1));
  }
  local_2e8._0_4_ = 3;
  local_288.m_prepared = (sqlite3_stmt *)CONCAT44(local_288.m_prepared._4_4_,4);
  sqlib::query<std::__cxx11::string>::operator()(local_1e8,(int *)local_2e8,(int *)&local_288);
  if (local_198._M_head_impl._0_1_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(add2) == true",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_198._M_head_impl._0_1_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(add2)",0xe);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  iVar8 = std::__cxx11::string::compare((char *)&local_1b8);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*add2) == \"7\"",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8 != &aStack_1a8) {
    operator_delete(local_1b8,
                    CONCAT44(aStack_1a8._M_allocated_capacity._4_4_,
                             aStack_1a8._M_allocated_capacity._0_4_) + 1);
  }
  sqlib::statement_base::~statement_base((statement_base *)local_1e8);
  sqlib::statement_base::~statement_base((statement_base *)local_258);
  sqlib::database::~database((database *)local_318);
  sqlite3_open(":memory:",local_2e8);
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"create table table1 (col1 integer, col2 text)","");
  sqlib::database::execute_sql((database *)local_2e8,(string *)local_1e8);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  psVar1 = (sqlite3_stmt *)(local_258 + 0x10);
  local_258._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_258,"select col1,col2 from table1","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_1e8,(database *)local_2e8,(string *)local_258);
  uStack_1b0 = 0;
  uStack_1ac = 0;
  aStack_1a8._M_allocated_capacity._0_4_ = aStack_1a8._M_allocated_capacity._0_4_ & 0xffffff00;
  local_198._M_head_impl = 0;
  local_190[0] = (long *)((ulong)local_190[0] & 0xffffffffffffff00);
  local_1b8 = (pointer)&aStack_1a8;
  if ((sqlite3_stmt *)local_258._0_8_ != psVar1) {
    operator_delete((void *)local_258._0_8_,(ulong)(local_248[0]._M_allocated_capacity + 1));
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()<>((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1e8);
  if (local_190[0]._0_1_ == (string)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_258[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_258,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1) == false",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8 != &aStack_1a8) {
    operator_delete(local_1b8,
                    CONCAT44(aStack_1a8._M_allocated_capacity._4_4_,
                             aStack_1a8._M_allocated_capacity._0_4_) + 1);
  }
  sqlib::statement_base::~statement_base((statement_base *)local_1e8);
  sqlib::database::~database((database *)local_2e8);
  sqlite3_open(":memory:",local_318);
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"create table table1 (col1 integer, col2 text)","");
  sqlib::database::execute_sql((database *)local_318,(string *)local_1e8);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"insert into table1 (col1,col2) values(?1,?2)","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_258,(database *)local_318,(string *)local_1e8);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  local_1e8._0_4_ = 1;
  psVar11 = sqlib::statement::operator()
                      ((statement *)local_258,(int *)local_1e8,(char (*) [6])"first");
  local_2e8._0_4_ = 2;
  psVar11 = sqlib::statement::operator()(psVar11,(int *)local_2e8,(char (*) [7])"second");
  local_288.m_prepared = (sqlite3_stmt *)CONCAT44(local_288.m_prepared._4_4_,3);
  sqlib::statement::operator()(psVar11,(int *)&local_288,(char (*) [6])"third");
  local_2e8 = (undefined1  [8])local_2d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2e8,"select col1,col2 from table1 order by col1 asc","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_1e8,(database *)local_318,(string *)local_2e8);
  uStack_1b0 = 0;
  uStack_1ac = 0;
  aStack_1a8._M_allocated_capacity._0_4_ = aStack_1a8._M_allocated_capacity._0_4_ & 0xffffff00;
  local_198._M_head_impl = 0;
  local_190[0] = (long *)((ulong)local_190[0] & 0xffffffffffffff00);
  local_1b8 = (pointer)&aStack_1a8;
  if (local_2e8 != (undefined1  [8])local_2d8) {
    operator_delete((void *)local_2e8,(ulong)((long)local_2d8 + 1));
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()<>((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1e8);
  if (local_190[0]._0_1_ == (string)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (local_198._M_head_impl != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 1",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_190[0]._0_1_ == (string)0x0) {
LAB_0010a11d:
    __function = 
    "row_type &sqlib::query<int, std::basic_string<char>>::operator*() [Cols = <int, std::basic_string<char>>]"
    ;
LAB_0010a132:
    __assert_fail("m_has_data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/./sqlib/query.h"
                  ,0x5f,__function);
  }
  iVar8 = std::__cxx11::string::compare((char *)&local_1b8);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<1>(*query1) == \"first\"",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1e8);
  if (local_190[0]._0_1_ == (string)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x31);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (local_198._M_head_impl != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x31);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 2",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_190[0]._0_1_ == (string)0x0) goto LAB_0010a11d;
  iVar8 = std::__cxx11::string::compare((char *)&local_1b8);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x31);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<1>(*query1) == \"second\"",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1e8);
  if (local_190[0]._0_1_ == (string)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (local_198._M_head_impl != 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 3",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_190[0]._0_1_ == (string)0x0) goto LAB_0010a11d;
  iVar8 = std::__cxx11::string::compare((char *)&local_1b8);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x32);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<1>(*query1) == \"third\"",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1e8);
  if (local_190[0]._0_1_ == (string)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x33);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!has_data(query1)",0x11);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8 != &aStack_1a8) {
    operator_delete(local_1b8,
                    CONCAT44(aStack_1a8._M_allocated_capacity._4_4_,
                             aStack_1a8._M_allocated_capacity._0_4_) + 1);
  }
  sqlib::statement_base::~statement_base((statement_base *)local_1e8);
  sqlib::statement_base::~statement_base((statement_base *)local_258);
  sqlib::database::~database((database *)local_318);
  sqlite3_open(":memory:",&local_288);
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"create table table1 (col1 integer, col2 text)","");
  sqlib::database::execute_sql((database *)&local_288,(string *)local_1e8);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"insert into table1 (col1,col2) values(?1,?2)","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_258,(database *)&local_288,(string *)local_1e8);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  local_1e8._0_4_ = 1;
  psVar11 = sqlib::statement::operator()
                      ((statement *)local_258,(int *)local_1e8,(char (*) [6])"first");
  local_2e8._0_4_ = 2;
  psVar11 = sqlib::statement::operator()(psVar11,(int *)local_2e8,(char (*) [7])"second");
  local_318._0_4_ = 3;
  sqlib::statement::operator()(psVar11,(int *)local_318,(char (*) [6])"third");
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"update table1 set col2=?1 where col1=?2","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_2e8,(database *)&local_288,(string *)local_1e8);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  local_1e8._0_4_ = 1;
  psVar11 = sqlib::statement::operator()
                      ((statement *)local_2e8,(char (*) [4])"uno",(int *)local_1e8);
  iVar8 = sqlite3_changes((psVar11->super_statement_base).m_db);
  if (iVar8 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_1e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_1e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x3f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"update1(\"uno\",1).affected_rows() == 1",0x25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  local_1e8._0_4_ = 2;
  psVar11 = sqlib::statement::operator()
                      ((statement *)local_2e8,(char (*) [4])"dos",(int *)local_1e8);
  iVar8 = sqlite3_changes((psVar11->super_statement_base).m_db);
  if (iVar8 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_1e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_1e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"update1(\"dos\",2).affected_rows() == 1",0x25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  local_1e8._0_4_ = 3;
  psVar11 = sqlib::statement::operator()
                      ((statement *)local_2e8,(char (*) [5])"tres",(int *)local_1e8);
  iVar8 = sqlite3_changes((psVar11->super_statement_base).m_db);
  if (iVar8 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_1e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_1e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x41);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"update1(\"tres\",3).affected_rows() == 1",0x26);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,"select col1, col2 from table1 order by col1 asc","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_1e8,(database *)&local_288,(string *)local_318);
  uStack_1b0 = 0;
  uStack_1ac = 0;
  aStack_1a8._M_allocated_capacity._0_4_ = aStack_1a8._M_allocated_capacity._0_4_ & 0xffffff00;
  local_198._M_head_impl = 0;
  local_190[0] = (long *)((ulong)local_190[0] & 0xffffffffffffff00);
  local_1b8 = (pointer)&aStack_1a8;
  if ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
      )local_318._0_8_ !=
      (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
      )local_308) {
    operator_delete((void *)local_318._0_8_,local_308._0_8_ + 1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()<>((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1e8);
  if (local_190[0]._0_1_ == (string)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_318[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_318,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x45);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (local_198._M_head_impl != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_318[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_318,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x45);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 1",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_190[0]._0_1_ == (string)0x0) goto LAB_0010a11d;
  iVar8 = std::__cxx11::string::compare((char *)&local_1b8);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_318[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_318,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x45);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<1>(*query1) == \"uno\"",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1e8);
  if (local_190[0]._0_1_ == (string)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_318[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_318,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x46);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (local_198._M_head_impl != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_318[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_318,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x46);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 2",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_190[0]._0_1_ == (string)0x0) goto LAB_0010a11d;
  iVar8 = std::__cxx11::string::compare((char *)&local_1b8);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_318[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_318,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x46);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<1>(*query1) == \"dos\"",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1e8);
  if (local_190[0]._0_1_ == (string)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_318[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_318,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x47);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (local_198._M_head_impl != 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_318[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_318,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x47);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 3",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_190[0]._0_1_ == (string)0x0) goto LAB_0010a11d;
  iVar8 = std::__cxx11::string::compare((char *)&local_1b8);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_318[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_318,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x47);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<1>(*query1) == \"tres\"",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1e8);
  if (local_190[0]._0_1_ == (string)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_318[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_318,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!has_data(query1)",0x11);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8 != &aStack_1a8) {
    operator_delete(local_1b8,
                    CONCAT44(aStack_1a8._M_allocated_capacity._4_4_,
                             aStack_1a8._M_allocated_capacity._0_4_) + 1);
  }
  sqlib::statement_base::~statement_base((statement_base *)local_1e8);
  sqlib::statement_base::~statement_base((statement_base *)local_2e8);
  sqlib::statement_base::~statement_base((statement_base *)local_258);
  sqlib::database::~database((database *)&local_288);
  sqlite3_open(":memory:",&local_288);
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"create table table1 (col1 integer, col2 text)","");
  sqlib::database::execute_sql((database *)&local_288,(string *)local_1e8);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"insert into table1 (col1,col2) values(?1,?2)","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_258,(database *)&local_288,(string *)local_1e8);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  local_1e8._0_4_ = 1;
  psVar11 = sqlib::statement::operator()
                      ((statement *)local_258,(int *)local_1e8,(char (*) [6])"first");
  local_2e8._0_4_ = 2;
  psVar11 = sqlib::statement::operator()(psVar11,(int *)local_2e8,(char (*) [7])"second");
  local_318._0_4_ = 3;
  sqlib::statement::operator()(psVar11,(int *)local_318,(char (*) [6])"third");
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"delete from table1 where col2=?1","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_2e8,(database *)&local_288,(string *)local_1e8);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  psVar11 = sqlib::statement::operator()((statement *)local_2e8,(char (*) [6])"third");
  iVar8 = sqlite3_changes((psVar11->super_statement_base).m_db);
  if (iVar8 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_1e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_1e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"delete1(\"third\").affected_rows() == 1",0x25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  local_318._0_8_ = local_308;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_318,"select col2 from table1 order by col1 asc","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_1e8,(database *)&local_288,(string *)local_318);
  uStack_1b0 = 0;
  uStack_1ac = 0;
  aStack_1a8._M_allocated_capacity._0_4_ = aStack_1a8._M_allocated_capacity._0_4_ & 0xffffff00;
  local_198._M_head_impl = local_198._M_head_impl & 0xffffff00;
  local_1b8 = (pointer)&aStack_1a8;
  if ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
      )local_318._0_8_ !=
      (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
      )local_308) {
    operator_delete((void *)local_318._0_8_,local_308._0_8_ + 1);
  }
  sqlib::query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()<>((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1e8);
  if (local_198._M_head_impl._0_1_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_318[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_318,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x59);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  iVar8 = std::__cxx11::string::compare((char *)&local_1b8);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_318[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_318,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<0>(*query1) == \"first\"",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1e8);
  if (local_198._M_head_impl._0_1_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_318[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_318,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  iVar8 = std::__cxx11::string::compare((char *)&local_1b8);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_318[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_318,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<0>(*query1) == \"second\"",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1e8);
  if (local_198._M_head_impl._0_1_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_318[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_318,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x5c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!has_data(query1)",0x11);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  psVar11 = sqlib::statement::operator()((statement *)local_2e8,(char (*) [6])"first");
  iVar8 = sqlite3_changes((psVar11->super_statement_base).m_db);
  if (iVar8 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_318[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_318,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x5e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"delete1(\"first\").affected_rows() == 1",0x25);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  psVar11 = sqlib::statement::operator()((statement *)local_2e8,(char (*) [7])"second");
  iVar8 = sqlite3_changes((psVar11->super_statement_base).m_db);
  if (iVar8 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_318[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_318,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x5f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"delete1(\"second\").affected_rows() == 1",0x26);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()<>((query<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1e8);
  if (local_198._M_head_impl._0_1_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_318[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_318,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x62);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!has_data(query1)",0x11);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8 != &aStack_1a8) {
    operator_delete(local_1b8,
                    CONCAT44(aStack_1a8._M_allocated_capacity._4_4_,
                             aStack_1a8._M_allocated_capacity._0_4_) + 1);
  }
  sqlib::statement_base::~statement_base((statement_base *)local_1e8);
  sqlib::statement_base::~statement_base((statement_base *)local_2e8);
  sqlib::statement_base::~statement_base((statement_base *)local_258);
  sqlib::database::~database((database *)&local_288);
  sqlite3_open(":memory:",local_318);
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"create table table1 (col1 integer, col2 text)","");
  sqlib::database::execute_sql((database *)local_318,(string *)local_1e8);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"insert into table1 (col1,col2) values(?1,?2)","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_258,(database *)local_318,(string *)local_1e8);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  local_2e8 = (undefined1  [8])local_2d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2e8,"select col1 from table1 order by col1 asc","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_1e8,(database *)local_318,(string *)local_2e8);
  local_1b8 = local_1b8 & 0xffffff0000000000;
  if (local_2e8 != (undefined1  [8])local_2d8) {
    operator_delete((void *)local_2e8,(ulong)((long)local_2d8 + 1));
  }
  sqlib::transaction_lock::transaction_lock((transaction_lock *)local_2e8,(database *)local_318);
  local_288.m_prepared = (sqlite3_stmt *)CONCAT44(local_288.m_prepared._4_4_,1);
  psVar11 = sqlib::statement::operator()
                      ((statement *)local_258,(int *)&local_288,(char (*) [6])"first");
  iVar8 = sqlite3_changes((psVar11->super_statement_base).m_db);
  if (iVar8 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_288.m_prepared = (sqlite3_stmt *)CONCAT71(local_288.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_288,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x6f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"insert(1,\"first\").affected_rows() == 1",0x26);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  local_288.m_prepared = (sqlite3_stmt *)CONCAT44(local_288.m_prepared._4_4_,2);
  psVar11 = sqlib::statement::operator()
                      ((statement *)local_258,(int *)&local_288,(char (*) [7])"second");
  iVar8 = sqlite3_changes((psVar11->super_statement_base).m_db);
  if (iVar8 != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_288.m_prepared = (sqlite3_stmt *)CONCAT71(local_288.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_288,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x70);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"insert(2,\"second\").affected_rows() == 1",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::query<int>::operator()<>((query<int> *)local_1e8);
  if (local_1b8._4_1_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_288.m_prepared = (sqlite3_stmt *)CONCAT71(local_288.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_288,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x73);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if ((_Head_base<0UL,_int,_false>)local_1b8._0_4_ != (_Head_base<0UL,_int,_false>)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_288.m_prepared = (sqlite3_stmt *)CONCAT71(local_288.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_288,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x73);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 1",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::query<int>::operator++((query<int> *)local_1e8);
  if (local_1b8._4_1_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_288.m_prepared = (sqlite3_stmt *)CONCAT71(local_288.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_288,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x74);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if ((_Head_base<0UL,_int,_false>)local_1b8._0_4_ != (_Head_base<0UL,_int,_false>)0x2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_288.m_prepared = (sqlite3_stmt *)CONCAT71(local_288.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_288,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x74);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 2",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::query<int>::operator++((query<int> *)local_1e8);
  if (local_1b8._4_1_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_288.m_prepared = (sqlite3_stmt *)CONCAT71(local_288.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_288,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x75);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!has_data(query1)",0x11);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  sqlib::transaction_lock::~transaction_lock((transaction_lock *)local_2e8);
  sqlib::query<int>::operator()<>((query<int> *)local_1e8);
  if (local_1b8._4_1_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x7b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!has_data(query1)",0x11);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  sqlib::transaction_lock::transaction_lock((transaction_lock *)local_2e8,(database *)local_318);
  local_288.m_prepared = (sqlite3_stmt *)CONCAT44(local_288.m_prepared._4_4_,1);
  sqlib::statement::operator()((statement *)local_258,(int *)&local_288,(char (*) [6])"first");
  sqlib::query<int>::operator()<>((query<int> *)local_1e8);
  if (local_1b8._4_1_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_288.m_prepared = (sqlite3_stmt *)CONCAT71(local_288.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_288,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x83);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if ((_Head_base<0UL,_int,_false>)local_1b8._0_4_ != (_Head_base<0UL,_int,_false>)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_288.m_prepared = (sqlite3_stmt *)CONCAT71(local_288.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_288,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x83);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 1",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::query<int>::operator++((query<int> *)local_1e8);
  if (local_1b8._4_1_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_288.m_prepared = (sqlite3_stmt *)CONCAT71(local_288.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_288,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x84);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!has_data(query1)",0x11);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  sqlib::query<int>::operator()<>((query<int> *)local_1e8);
  sqlib::transaction_lock::commit((transaction_lock *)local_2e8);
  if (local_1b8._4_1_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_288.m_prepared = (sqlite3_stmt *)CONCAT71(local_288.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_288,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x89);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if ((_Head_base<0UL,_int,_false>)local_1b8._0_4_ != (_Head_base<0UL,_int,_false>)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_288.m_prepared = (sqlite3_stmt *)CONCAT71(local_288.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_288,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x89);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 1",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::query<int>::operator++((query<int> *)local_1e8);
  if (local_1b8._4_1_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_288.m_prepared = (sqlite3_stmt *)CONCAT71(local_288.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_288,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x8a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!has_data(query1)",0x11);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  sqlib::transaction_lock::~transaction_lock((transaction_lock *)local_2e8);
  sqlib::query<int>::operator()<>((query<int> *)local_1e8);
  if (local_1b8._4_1_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x8e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if ((_Head_base<0UL,_int,_false>)local_1b8._0_4_ != (_Head_base<0UL,_int,_false>)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x8e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 1",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::query<int>::operator++((query<int> *)local_1e8);
  if (local_1b8._4_1_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x8f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!has_data(query1)",0x11);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  sqlib::statement_base::~statement_base((statement_base *)local_1e8);
  sqlib::statement_base::~statement_base((statement_base *)local_258);
  sqlib::database::~database((database *)local_318);
  sqlite3_open(":memory:",&local_1f8);
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"create table table1 (col1 integer, col2 text)","");
  sqlib::database::execute_sql((database *)&local_1f8,(string *)local_1e8);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"insert into table1 (col1,col2) values(?1,?2)","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_318,(database *)&local_1f8,(string *)local_1e8);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  local_258._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_258,"select col1,col2 from table1 order by col1 asc","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_1e8,(database *)&local_1f8,(string *)local_258);
  uStack_1b0 = 0;
  uStack_1ac = 0;
  aStack_1a8._M_allocated_capacity._0_4_ = aStack_1a8._M_allocated_capacity._0_4_ & 0xffffff00;
  local_198._M_head_impl = 0;
  local_190[0] = (long *)((ulong)local_190[0] & 0xffffffffffffff00);
  local_1b8 = (pointer)&aStack_1a8;
  if ((sqlite3_stmt *)local_258._0_8_ != psVar1) {
    operator_delete((void *)local_258._0_8_,(ulong)(local_248[0]._M_allocated_capacity + 1));
  }
  local_258._0_4_ = 1;
  sqlib::statement::operator()((statement *)local_318,(int *)local_258,(char (*) [6])"first");
  sqlib::statement_base::statement_base(&local_288,(statement_base *)local_318);
  local_258._0_4_ = 2;
  sqlib::statement::operator()((statement *)&local_288,(int *)local_258,(char (*) [7])"second");
  local_68.m_sql._M_dataplus._M_p = (pointer)&local_68.m_sql.field_2;
  local_68.m_prepared = (sqlite3_stmt *)0x0;
  local_68.m_db = (sqlite3 *)0x0;
  local_68.m_sql._M_string_length = 0;
  local_68.m_sql.field_2._M_local_buf[0] = '\0';
  sqlib::statement_base::operator=(&local_68,(statement_base *)local_318);
  local_258._0_4_ = 3;
  sqlib::statement::operator()((statement *)&local_68,(int *)local_258,(char (*) [6])"third");
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()<>((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1e8);
  if (local_190[0]._0_1_ == (string)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_258[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_258,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xa5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (local_198._M_head_impl != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_258[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_258,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xa5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 1",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_190[0]._0_1_ == (string)0x0) goto LAB_0010a11d;
  iVar8 = std::__cxx11::string::compare((char *)&local_1b8);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_258[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_258,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xa5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<1>(*query1) == \"first\"",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1e8);
  if (local_190[0]._0_1_ == (string)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_258[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_258,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xa6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (local_198._M_head_impl != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_258[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_258,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xa6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 2",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_190[0]._0_1_ == (string)0x0) goto LAB_0010a11d;
  iVar8 = std::__cxx11::string::compare((char *)&local_1b8);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_258[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_258,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xa6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<1>(*query1) == \"second\"",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1e8);
  if (local_190[0]._0_1_ == (string)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_258[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_258,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xa7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (local_198._M_head_impl != 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_258[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_258,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xa7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 3",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_190[0]._0_1_ == (string)0x0) goto LAB_0010a11d;
  iVar8 = std::__cxx11::string::compare((char *)&local_1b8);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_258[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_258,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xa7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<1>(*query1) == \"third\"",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1e8);
  if (local_190[0]._0_1_ == (string)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_258[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_258,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xa8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!has_data(query1)",0x11);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()<>((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1e8);
  if (local_190[0]._0_1_ == (string)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_258[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_258,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xab);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (local_198._M_head_impl != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_258[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_258,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xab);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 1",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_190[0]._0_1_ == (string)0x0) goto LAB_0010a11d;
  iVar8 = std::__cxx11::string::compare((char *)&local_1b8);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_258[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_258,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xab);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<1>(*query1) == \"first\"",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1e8);
  sqlib::statement_base::statement_base((statement_base *)local_258,(statement_base *)local_1e8);
  local_220 = 0;
  local_218._M_local_buf[0] = '\0';
  local_208._M_head_impl = 0;
  local_200 = false;
  local_228 = (pointer)&local_218;
  if (local_190[0]._0_1_ == (string)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xb0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (local_198._M_head_impl != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xb0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 2",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_190[0]._0_1_ == (string)0x0) goto LAB_0010a11d;
  iVar8 = std::__cxx11::string::compare((char *)&local_1b8);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xb0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<1>(*query1) == \"second\"",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1e8);
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()<>((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_258);
  if (local_200 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xb3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query_copy)",0x14);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (local_208._M_head_impl != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xb3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query_copy) == 1",0x1d)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_200 == false) goto LAB_0010a11d;
  iVar8 = std::__cxx11::string::compare((char *)&local_228);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xb3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<1>(*query_copy) == \"first\"",0x23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_258);
  if (local_200 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xb4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query_copy)",0x14);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (local_208._M_head_impl != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xb4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query_copy) == 2",0x1d)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_200 == false) goto LAB_0010a11d;
  iVar8 = std::__cxx11::string::compare((char *)&local_228);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xb4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<1>(*query_copy) == \"second\"",0x24);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_258);
  if (local_200 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xb5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query_copy)",0x14);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (local_208._M_head_impl != 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xb5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query_copy) == 3",0x1d)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_200 == false) goto LAB_0010a11d;
  iVar8 = std::__cxx11::string::compare((char *)&local_228);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xb5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<1>(*query_copy) == \"third\"",0x23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_258);
  if (local_200 == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xb6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!has_data(query_copy)",0x15);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  local_2d8 = (undefined1  [8])(local_2d0 + 8);
  local_2e8 = (undefined1  [8])0x0;
  _Stack_2e0._M_p = (pointer)0x0;
  local_2d0._0_8_ = 0;
  local_2d0[8] = '\0';
  local_2b0 = 0;
  local_2a8._M_local_buf[0] = '\0';
  local_298._M_head_impl = 0;
  local_2b8._M_p = (pointer)&local_2a8;
  sqlib::statement_base::operator=((statement_base *)local_2e8,(statement_base *)local_1e8);
  local_290 = false;
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()<>((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_2e8);
  if (local_290 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_320.m_sqlite._0_1_ = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_320,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xbd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query_assignment)",0x1a);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (local_298._M_head_impl != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_320.m_sqlite._0_1_ = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_320,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xbd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<0>(*query_assignment) == 1",0x23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_290 == false) goto LAB_0010a11d;
  iVar8 = std::__cxx11::string::compare((char *)&local_2b8);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_320.m_sqlite._0_1_ = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_320,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xbd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<1>(*query_assignment) == \"first\"",0x29);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_2e8);
  if (local_290 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_320.m_sqlite._0_1_ = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_320,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xbe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query_assignment)",0x1a);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (local_298._M_head_impl != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_320.m_sqlite._0_1_ = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_320,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xbe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<0>(*query_assignment) == 2",0x23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_290 == false) goto LAB_0010a11d;
  iVar8 = std::__cxx11::string::compare((char *)&local_2b8);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_320.m_sqlite._0_1_ = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_320,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xbe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<1>(*query_assignment) == \"second\"",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_2e8);
  if (local_290 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_320.m_sqlite._0_1_ = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_320,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xbf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query_assignment)",0x1a);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (local_298._M_head_impl != 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_320.m_sqlite._0_1_ = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_320,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xbf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<0>(*query_assignment) == 3",0x23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_290 == false) goto LAB_0010a11d;
  iVar8 = std::__cxx11::string::compare((char *)&local_2b8);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_320.m_sqlite._0_1_ = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_320,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xbf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<1>(*query_assignment) == \"third\"",0x29);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_2e8);
  if (local_290 == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_320.m_sqlite._0_1_ = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_320,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xc0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!has_data(query_assignment)",0x1b);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (local_190[0]._0_1_ == (string)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_320.m_sqlite._0_1_ = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_320,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xc2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (local_198._M_head_impl != 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_320.m_sqlite._0_1_ = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_320,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xc2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 3",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_190[0]._0_1_ == (string)0x0) goto LAB_0010a11d;
  iVar8 = std::__cxx11::string::compare((char *)&local_1b8);
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_320.m_sqlite._0_1_ = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_320,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xc2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<1>(*query1) == \"third\"",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::
  query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1e8);
  if (local_190[0]._0_1_ == (string)0x1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_320.m_sqlite._0_1_ = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_320,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xc3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!has_data(query1)",0x11);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_p != &local_2a8) {
    operator_delete(local_2b8._M_p,
                    CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1);
  }
  sqlib::statement_base::~statement_base((statement_base *)local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228 != &local_218) {
    operator_delete(local_228,
                    CONCAT71(local_218._M_allocated_capacity._1_7_,local_218._M_local_buf[0]) + 1);
  }
  sqlib::statement_base::~statement_base((statement_base *)local_258);
  sqlib::statement_base::~statement_base(&local_68);
  sqlib::statement_base::~statement_base(&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8 != &aStack_1a8) {
    operator_delete(local_1b8,
                    CONCAT44(aStack_1a8._M_allocated_capacity._4_4_,
                             aStack_1a8._M_allocated_capacity._0_4_) + 1);
  }
  sqlib::statement_base::~statement_base((statement_base *)local_1e8);
  sqlib::statement_base::~statement_base((statement_base *)local_318);
  sqlib::database::~database((database *)&local_1f8);
  sqlite3_open(":memory:",&local_288);
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"create table table1 (col1 integer, col2 blob)","");
  sqlib::database::execute_sql((database *)&local_288,(string *)local_1e8);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"insert into table1 (col1,col2) values(?1,?2)","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_258,(database *)&local_288,(string *)local_1e8);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  local_2e8 = (undefined1  [8])local_2d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2e8,"select col1,col2 from table1 order by col1 asc","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_1e8,(database *)&local_288,(string *)local_2e8);
  aStack_1a8._M_allocated_capacity._0_4_ = 0;
  aStack_1a8._M_allocated_capacity._4_4_ = 0;
  aStack_1a8._8_4_ = 0;
  local_1b8 = (pointer)0x0;
  uStack_1b0 = 0;
  uStack_1ac = 0;
  local_198._M_head_impl = local_198._M_head_impl & 0xffffff00;
  if (local_2e8 != (undefined1  [8])local_2d8) {
    operator_delete((void *)local_2e8,(ulong)((long)local_2d8 + 1));
  }
  iVar8 = 0;
  local_2d8 = (undefined1  [8])0x0;
  local_2e8 = (undefined1  [8])0x0;
  _Stack_2e0._M_p = (pointer)0x0;
  local_308._0_8_ = 0;
  local_318._0_8_ =
       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_318._8_8_ =
       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  do {
    local_68.m_prepared = (sqlite3_stmt *)CONCAT71(local_68.m_prepared._1_7_,(char)iVar8);
    std::vector<char,_std::allocator<char>_>::emplace_back<char>
              ((vector<char,_std::allocator<char>_> *)local_2e8,(char *)&local_68);
    iVar8 = iVar8 + 1;
  } while (iVar8 != 0x100);
  local_68.m_prepared._0_4_ = 1;
  sqlib::statement::operator()
            ((statement *)local_258,(int *)&local_68,
             (vector<char,_std::allocator<char>_> *)local_2e8);
  local_68.m_prepared = (sqlite3_stmt *)CONCAT44(local_68.m_prepared._4_4_,2);
  sqlib::statement::operator()
            ((statement *)local_258,(int *)&local_68,
             (vector<char,_std::allocator<char>_> *)local_318);
  sqlib::query<int,_std::vector<char,_std::allocator<char>_>_>::operator()<>
            ((query<int,_std::vector<char,_std::allocator<char>_>_> *)local_1e8);
  if (local_198._M_head_impl._0_1_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_68.m_prepared = (sqlite3_stmt *)CONCAT71(local_68.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_68,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xd8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (aStack_1a8._8_4_ != 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_68.m_prepared = (sqlite3_stmt *)CONCAT71(local_68.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_68,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xd8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 1",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_198._M_head_impl._0_1_ == false) {
LAB_0010a13c:
    __function = 
    "row_type &sqlib::query<int, std::vector<char>>::operator*() [Cols = <int, std::vector<char>>]";
    goto LAB_0010a132;
  }
  sVar15 = (long)CONCAT44(uStack_1ac,uStack_1b0) - (long)local_1b8;
  if (sVar15 == (long)_Stack_2e0._M_p - (long)local_2e8) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_1ac,uStack_1b0) !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8) {
      iVar8 = bcmp(local_1b8,(void *)local_2e8,sVar15);
      if (iVar8 != 0) goto LAB_0010912c;
    }
  }
  else {
LAB_0010912c:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_68.m_prepared = (sqlite3_stmt *)CONCAT71(local_68.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_68,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xd8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<1>(*query1) == blob",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::query<int,_std::vector<char,_std::allocator<char>_>_>::operator++
            ((query<int,_std::vector<char,_std::allocator<char>_>_> *)local_1e8);
  if (local_198._M_head_impl._0_1_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_68.m_prepared = (sqlite3_stmt *)CONCAT71(local_68.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_68,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xd9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if (aStack_1a8._8_4_ != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_68.m_prepared = (sqlite3_stmt *)CONCAT71(local_68.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_68,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xd9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 2",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if (local_198._M_head_impl._0_1_ == false) goto LAB_0010a13c;
  sVar15 = (long)CONCAT44(uStack_1ac,uStack_1b0) - (long)local_1b8;
  if (sVar15 == local_318._8_8_ - local_318._0_8_) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_1ac,uStack_1b0) !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8) {
      iVar8 = bcmp(local_1b8,(void *)local_318._0_8_,sVar15);
      if (iVar8 != 0) goto LAB_001092d1;
    }
  }
  else {
LAB_001092d1:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_68.m_prepared = (sqlite3_stmt *)CONCAT71(local_68.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_68,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xd9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"std::get<1>(*query1) == empty_blob",0x22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::query<int,_std::vector<char,_std::allocator<char>_>_>::operator++
            ((query<int,_std::vector<char,_std::allocator<char>_>_> *)local_1e8);
  if (local_198._M_head_impl._0_1_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_68.m_prepared = (sqlite3_stmt *)CONCAT71(local_68.m_prepared._1_7_,0x3a);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_68,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xda);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!has_data(query1)",0x11);
    std::operator<<(poVar10,"\n");
LAB_0010bbaf:
    exit(1);
  }
  if ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
      )local_318._0_8_ !=
      (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
      )0x0) {
    operator_delete((void *)local_318._0_8_,local_308._0_8_ - local_318._0_8_);
  }
  if (local_2e8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2e8,(long)local_2d8 - (long)local_2e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_1b8,
                    CONCAT44(aStack_1a8._M_allocated_capacity._4_4_,
                             aStack_1a8._M_allocated_capacity._0_4_) - (long)local_1b8);
  }
  sqlib::statement_base::~statement_base((statement_base *)local_1e8);
  sqlib::statement_base::~statement_base((statement_base *)local_258);
  sqlib::database::~database((database *)&local_288);
  sqlite3_open(":memory:",local_1e8);
  sqlite3_open(":memory:",local_258);
  auVar5 = local_1e8;
  local_1e8 = (undefined1  [8])local_258._0_8_;
  local_258._0_8_ = auVar5;
  sqlib::database::~database((database *)local_258);
  sqlib::database::~database((database *)local_1e8);
  sqlite3_open(":memory:",(database *)local_1e8);
  local_258._0_8_ = local_1e8;
  local_1e8 = (undefined1  [8])0x0;
  sqlib::database::~database((database *)local_258);
  sqlib::database::~database((database *)local_1e8);
  sqlite3_open(":memory:",local_318);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  sqlite3_trace(local_318._0_8_,sqlib::database::trace_fn,local_1e8);
  local_2e8 = (undefined1  [8])local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"select ?1+?2","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_258,(database *)local_318,(string *)local_2e8);
  local_228 = local_228 & 0xffffff0000000000;
  if (local_2e8 != (undefined1  [8])local_2d8) {
    operator_delete((void *)local_2e8,(ulong)((long)local_2d8 + 1));
  }
  local_2e8._0_4_ = 3;
  local_288.m_prepared = (sqlite3_stmt *)CONCAT44(local_288.m_prepared._4_4_,5);
  sqlib::query<int>::operator()((query<int> *)local_258,(int *)local_2e8,(int *)&local_288);
  if (local_228._4_1_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xf3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"has_data(query1)",0x10);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  if ((_Head_base<0UL,_int,_false>)local_228._0_4_ != (_Head_base<0UL,_int,_false>)0x8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xf3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::get<0>(*query1) == 8",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::query<int>::operator++((query<int> *)local_258);
  if (local_228._4_1_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xf4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," (fatal)\n   ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!has_data(query1)",0x11);
    std::operator<<(poVar10,"\n");
    goto LAB_0010bbaf;
  }
  std::__cxx11::stringbuf::str();
  iVar8 = std::__cxx11::string::compare(local_2e8);
  if (local_2e8 != (undefined1  [8])local_2d8) {
    operator_delete((void *)local_2e8,(ulong)((long)local_2d8 + 1));
  }
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xf6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"os.str() == \"select 3+5\\n\"",0x1a)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlite3_trace(local_318._0_8_,0,0);
  local_2e8._0_4_ = 1;
  local_288.m_prepared = (sqlite3_stmt *)CONCAT44(local_288.m_prepared._4_4_,2);
  sqlib::query<int>::operator()((query<int> *)local_258,(int *)local_2e8,(int *)&local_288);
  std::__cxx11::stringbuf::str();
  iVar8 = std::__cxx11::string::compare(local_2e8);
  if (local_2e8 != (undefined1  [8])local_2d8) {
    operator_delete((void *)local_2e8,(ulong)((long)local_2d8 + 1));
  }
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xfb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"os.str() == \"select 3+5\\n\"",0x1a)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  sqlib::statement_base::~statement_base((statement_base *)local_258);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base(local_178);
  sqlib::database::~database((database *)local_318);
  sqlite3_open(":memory:",&local_68);
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"create table table1 (col1 integer, col2 text)","");
  sqlib::database::execute_sql((database *)&local_68,(string *)local_1e8);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  local_1e8._0_4_ = 1;
  local_1e0._M_p = local_1d8 + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"first","");
  local_1d8._24_4_ = 2;
  local_1b8 = (pointer)&aStack_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"second","");
  local_198._M_head_impl = 3;
  plVar16 = &local_180;
  local_190[0] = plVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"third","");
  __l._M_len = 3;
  __l._M_array = (iterator)local_1e8;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_318,__l,(allocator_type *)local_258);
  lVar18 = -0x78;
  do {
    if (plVar16 != (long *)plVar16[-2]) {
      operator_delete((long *)plVar16[-2],*plVar16 + 1);
    }
    plVar16 = plVar16 + -5;
    lVar18 = lVar18 + 0x28;
  } while (lVar18 != 0);
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"insert into table1 (col1,col2) values(?1,?2)","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_258,(database *)&local_68,(string *)local_1e8);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  uVar3 = local_318._8_8_;
  if (local_318._0_8_ != local_318._8_8_) {
    ppVar17 = (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_318._0_8_;
    do {
      sqlib::statement::operator()((statement *)local_258,&ppVar17->first,&ppVar17->second);
      ppVar17 = ppVar17 + 1;
    } while (ppVar17 !=
             (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)uVar3);
  }
  local_288.m_prepared = (sqlite3_stmt *)0x0;
  local_288.m_db = (sqlite3 *)0x0;
  local_288.m_sql._M_dataplus._M_p = (pointer)0x0;
  local_2e8 = (undefined1  [8])local_2d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2e8,"select col1,col2 from table1","");
  sqlib::statement_base::statement_base
            ((statement_base *)local_1e8,(database *)&local_68,(string *)local_2e8);
  local_1b8 = (pointer)&aStack_1a8;
  uStack_1b0 = 0;
  uStack_1ac = 0;
  aStack_1a8._M_allocated_capacity._0_4_ = aStack_1a8._M_allocated_capacity._0_4_ & 0xffffff00;
  local_198._M_head_impl = 0;
  local_190[0] = (long *)((ulong)local_190[0] & 0xffffffffffffff00);
  if (local_2e8 != (undefined1  [8])local_2d8) {
    operator_delete((void *)local_2e8,(ulong)((long)local_2d8 + 1));
  }
  pqVar12 = sqlib::
            query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()<>((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_1e8);
  local_1f8.m_prepared =
       (sqlite3_stmt *)
       (query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  if (pqVar12->m_has_data != false) {
    local_1f8.m_prepared = (sqlite3_stmt *)pqVar12;
  }
  if (pqVar12->m_has_data == true) {
    do {
      prVar13 = sqlib::
                row_iterator<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*((row_iterator<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_1f8);
      local_2e8._0_4_ =
           (prVar13->
           super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).super__Head_base<0UL,_int,_false>._M_head_impl;
      pcVar2 = (prVar13->
               super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_dataplus._M_p;
      _Stack_2e0._M_p = (pointer)local_2d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_2e0,pcVar2,
                 pcVar2 + (prVar13->
                          super__Tuple_impl<0UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).
                          super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .
                          super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          ._M_head_impl._M_string_length);
      std::
      vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
      ::emplace_back<std::pair<int,std::__cxx11::string>>
                ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                  *)&local_288,
                 (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_2e8);
      if ((sqlite3 *)_Stack_2e0._M_p != (sqlite3 *)local_2d0) {
        operator_delete(_Stack_2e0._M_p,local_2d0._0_8_ + 1);
      }
      sqlib::
      query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator++((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1f8.m_prepared);
      if (*(bool *)((long)local_1f8.m_prepared + 0x58) == false) {
        local_1f8.m_prepared = (sqlite3_stmt *)0x0;
      }
    } while ((query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1f8.m_prepared !=
             (query<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0);
  }
  if (local_318._8_8_ - local_318._0_8_ == (long)local_288.m_db - (long)local_288.m_prepared) {
    bVar7 = std::__equal<false>::
            equal<std::pair<int,std::__cxx11::string>const*,std::pair<int,std::__cxx11::string>const*>
                      ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_318._0_8_,
                       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_318._8_8_,
                       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_288.m_prepared);
    if (!bVar7) goto LAB_00109b8a;
  }
  else {
LAB_00109b8a:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Check failed on ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
               ,0x5b);
    local_2e8[0] = 0x3a;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x110);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"data == result",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8 != &aStack_1a8) {
    operator_delete(local_1b8,
                    CONCAT44(aStack_1a8._M_allocated_capacity._4_4_,
                             aStack_1a8._M_allocated_capacity._0_4_) + 1);
  }
  sqlib::statement_base::~statement_base((statement_base *)local_1e8);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_288);
  sqlib::statement_base::~statement_base((statement_base *)local_258);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_318);
  sqlib::database::~database((database *)&local_68);
  sqlite3_open(":memory:",&local_320);
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"create table table1 (col1 integer, col2 text)","");
  sqlib::database::execute_sql(&local_320,(string *)local_1e8);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  local_1e8._0_4_ = 1;
  local_1e0._M_p = (pointer)(local_1d8 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"first","");
  local_1d8._24_4_ = 2;
  local_1b8 = (pointer)&aStack_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"second","");
  local_198._M_head_impl = 3;
  plVar16 = &local_180;
  local_190[0] = plVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"third","");
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_1e8;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&local_288,__l_00,(allocator_type *)local_258);
  lVar18 = -0x78;
  do {
    if (plVar16 != (long *)plVar16[-2]) {
      operator_delete((long *)plVar16[-2],*plVar16 + 1);
    }
    plVar16 = plVar16 + -5;
    lVar18 = lVar18 + 0x28;
  } while (lVar18 != 0);
  local_1e8 = (undefined1  [8])local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"insert into table1 (col1,col2) values(?1,?2)","");
  sqlib::statement_base::statement_base((statement_base *)local_258,&local_320,(string *)local_1e8);
  if (local_1e8 != (undefined1  [8])local_1d8) {
    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
  }
  psVar4 = local_288.m_db;
  if (local_288.m_prepared != (sqlite3_stmt *)local_288.m_db) {
    ppVar17 = (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_288.m_prepared;
    do {
      sqlib::statement::operator()((statement *)local_258,&ppVar17->first,&ppVar17->second);
      ppVar17 = ppVar17 + 1;
    } while (ppVar17 !=
             (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)psVar4);
  }
  local_68.m_prepared = (sqlite3_stmt *)0x0;
  local_68.m_db = (sqlite3 *)0x0;
  local_68.m_sql._M_dataplus._M_p = (pointer)0x0;
  local_2e8 = (undefined1  [8])local_2d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2e8,"select col1,col2 from table1","");
  sqlib::statement_base::statement_base((statement_base *)local_1e8,&local_320,(string *)local_2e8);
  local_1b8 = local_1b8 & 0xffffffffffffff00;
  if (local_2e8 != (undefined1  [8])local_2d8) {
    operator_delete((void *)local_2e8,(ulong)((long)local_2d8 + 1));
  }
  pdVar14 = sqlib::dynquery::operator()<>((dynquery *)local_1e8);
  local_70.m_query = (dynquery *)0x0;
  if (pdVar14->m_has_data != false) {
    local_70.m_query = pdVar14;
  }
  if (pdVar14->m_has_data == true) {
    do {
      dVar19 = sqlib::dynrow_iterator::operator*(&local_70);
      local_1f8.m_prepared = dVar19.m_prepared;
      local_318._0_8_ = local_308;
      local_318._8_8_ =
           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x0;
      local_308._0_8_ = local_308._0_8_ & 0xffffffffffffff00;
      local_1f8.m_next_column = dVar19.m_next_column + 1;
      uVar9 = sqlite3_column_int(local_1f8.m_prepared,dVar19.m_next_column);
      sqlib::dynrow::get<std::__cxx11::string>
                (&local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318);
      local_2e8._0_4_ = uVar9;
      _Stack_2e0._M_p = (pointer)local_2d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_2e0,local_318._0_8_,
                 (sqlite3 *)(local_318._0_8_ + (long)(int *)local_318._8_8_));
      std::
      vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
      ::emplace_back<std::pair<int,std::__cxx11::string>>
                ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                  *)&local_68,
                 (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_2e8);
      if ((sqlite3 *)_Stack_2e0._M_p != (sqlite3 *)local_2d0) {
        operator_delete(_Stack_2e0._M_p,local_2d0._0_8_ + 1);
      }
      if ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_318._0_8_ !=
          (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_308) {
        operator_delete((void *)local_318._0_8_,local_308._0_8_ + 1);
      }
      dVar6.m_query = local_70.m_query;
      iVar8 = sqlib::statement_base::step(&(local_70.m_query)->super_statement_base);
      (dVar6.m_query)->m_has_data = iVar8 == 100;
      if ((local_70.m_query)->m_has_data == false) {
        local_70.m_query = (dynquery *)0x0;
      }
    } while (local_70.m_query != (dynquery *)0x0);
  }
  if ((long)local_288.m_db - (long)local_288.m_prepared ==
      (long)local_68.m_db - (long)local_68.m_prepared) {
    bVar7 = std::__equal<false>::
            equal<std::pair<int,std::__cxx11::string>const*,std::pair<int,std::__cxx11::string>const*>
                      ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_288.m_prepared,
                       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_288.m_db,
                       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_68.m_prepared);
    if (bVar7) goto LAB_0010a0cb;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Check failed on ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kalven[P]sqlib2/tests/basic_test.cpp"
             ,0x5b);
  local_2e8[0] = 0x3a;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2e8,1);
  poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0x129);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n   ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"data == result",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
LAB_0010a0cb:
  sqlib::statement_base::~statement_base((statement_base *)local_1e8);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_68);
  sqlib::statement_base::~statement_base((statement_base *)local_258);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_288);
  sqlib::database::~database(&local_320);
  return 0;
}

Assistant:

int main() {
  const char * const table_def = "create table table1 (col1 integer, col2 text)";
  const char * const table_def2 = "create table table1 (col1 integer, col2 blob)";

  {
    database db1(":memory:");

    query<int> add1(db1, "select ?1+?2");
    add1(3,4);

    SQLIB_CHECK(has_data(add1) == true);
    CHECK_ROW1(add1, 7);

    query<string> add2(db1, "select ?1+?2");
    add2(3,4);
    SQLIB_CHECK(has_data(add2) == true);
    CHECK_ROW1(add2, "7");
  }

  {
    database db1(":memory:");
    db1.execute_sql(table_def);

    query<int,string> query1(db1, "select col1,col2 from table1");
    query1();

    SQLIB_CHECK(has_data(query1) == false);
  }

  {
    database db1(":memory:");
    db1.execute_sql(table_def);

    statement insert1(db1, "insert into table1 (col1,col2) values(?1,?2)");

    insert1(1,"first")(2,"second")(3,"third");

    query<int,string> query1(db1, "select col1,col2 from table1 order by col1 asc");
    query1();
    CHECK_ROW2(query1, 1, "first");
    CHECK_ROW2(query1, 2, "second");
    CHECK_ROW2(query1, 3, "third");
    CHECK_DONE(query1);
  }

  {
    database db1(":memory:");

    db1.execute_sql(table_def);

    statement insert(db1, "insert into table1 (col1,col2) values(?1,?2)");
    insert(1,"first")(2,"second")(3,"third");

    statement update1(db1, "update table1 set col2=?1 where col1=?2");
    SQLIB_CHECK(update1("uno",1).affected_rows() == 1);
    SQLIB_CHECK(update1("dos",2).affected_rows() == 1);
    SQLIB_CHECK(update1("tres",3).affected_rows() == 1);

    query<int,string> query1(db1, "select col1, col2 from table1 order by col1 asc");
    query1();
    CHECK_ROW2(query1, 1, "uno");
    CHECK_ROW2(query1, 2, "dos");
    CHECK_ROW2(query1, 3, "tres");
    CHECK_DONE(query1);
  }

  {
    database db1(":memory:");

    db1.execute_sql(table_def);

    statement insert(db1, "insert into table1 (col1,col2) values(?1,?2)");
    insert(1,"first")(2,"second")(3,"third");

    statement delete1(db1, "delete from table1 where col2=?1");
    SQLIB_CHECK(delete1("third").affected_rows() == 1);

    query<string> query1(db1, "select col2 from table1 order by col1 asc");
    query1();

    SQLIB_REQUIRE(has_data(query1));
    CHECK_ROW1(query1, "first");
    CHECK_ROW1(query1, "second");
    CHECK_DONE(query1);

    SQLIB_CHECK(delete1("first").affected_rows() == 1);
    SQLIB_CHECK(delete1("second").affected_rows() == 1);

    query1();
    CHECK_DONE(query1);
  }

  {
    database db1(":memory:");
    db1.execute_sql(table_def);

    statement insert(db1, "insert into table1 (col1,col2) values(?1,?2)");
    query<int> query1(db1, "select col1 from table1 order by col1 asc");

    {
      // Start a transaction
      transaction_lock lock(db1);
      SQLIB_CHECK(insert(1,"first").affected_rows() == 1);
      SQLIB_CHECK(insert(2,"second").affected_rows() == 1);

      query1();
      CHECK_ROW1(query1, 1);
      CHECK_ROW1(query1, 2);
      CHECK_DONE(query1);

      // Leave scope without commit
    }

    query1();
    CHECK_DONE(query1);

    {
      // Start another transaction
      transaction_lock lock(db1);
      insert(1,"first");

      query1();
      CHECK_ROW1(query1, 1);
      CHECK_DONE(query1);

      query1();
      lock.commit();

      CHECK_ROW1(query1, 1);
      CHECK_DONE(query1);
    }

    query1();
    CHECK_ROW1(query1, 1);
    CHECK_DONE(query1);
  }

  {
    database db1(":memory:");
    db1.execute_sql(table_def);

    typedef query<int,string> query_t;

    statement inserter(db1, "insert into table1 (col1,col2) values(?1,?2)");
    query_t query1(db1, "select col1,col2 from table1 order by col1 asc");

    inserter(1,"first");

    statement inserter_copy = inserter;
    inserter_copy(2,"second");

    statement inserter_assign;
    inserter_assign = inserter;
    inserter_assign(3,"third");

    query1();
    CHECK_ROW2(query1, 1, "first");
    CHECK_ROW2(query1, 2, "second");
    CHECK_ROW2(query1, 3, "third");
    CHECK_DONE(query1);

    query1();
    CHECK_ROW2(query1, 1, "first");

    query_t query_copy = query1;
    CHECK_DONE(query_copy);

    CHECK_ROW2(query1, 2, "second");

    query_copy();
    CHECK_ROW2(query_copy, 1, "first");
    CHECK_ROW2(query_copy, 2, "second");
    CHECK_ROW2(query_copy, 3, "third");
    CHECK_DONE(query_copy);

    query_t query_assignment;
    query_assignment = query1;
    CHECK_DONE(query_assignment);

    query_assignment();
    CHECK_ROW2(query_assignment, 1, "first");
    CHECK_ROW2(query_assignment, 2, "second");
    CHECK_ROW2(query_assignment, 3, "third");
    CHECK_DONE(query_assignment);

    CHECK_ROW2(query1, 3, "third");
    CHECK_DONE(query1);
  }

  {
    database db1(":memory:");
    db1.execute_sql(table_def2);

    typedef query<int,blob_type> query_t;

    statement inserter(db1, "insert into table1 (col1,col2) values(?1,?2)");
    query_t query1(db1, "select col1,col2 from table1 order by col1 asc");

    // Prepare the blob with some data
    blob_type blob, empty_blob;
    for(int i = 0; i != 256; ++i)
      blob.push_back(static_cast<char>(i));

    inserter(1, blob);
    inserter(2, empty_blob);

    query1();
    CHECK_ROW2(query1, 1, blob);
    CHECK_ROW2(query1, 2, empty_blob);
    CHECK_DONE(query1);
  }

  // move assignment operator
  {
    database db1(":memory:"), db2(":memory:");
    db1 = std::move(db2);
  }

  // move copy constructor
  {
    database db1(":memory:");
    database db2(std::move(db1));
  }

  // trace test
  {
    database db1(":memory:");

    std::ostringstream os;
    db1.enable_trace(os);

    query<int> query1(db1, "select ?1+?2");
    query1(3,5);

    CHECK_ROW1(query1, 8);
    CHECK_DONE(query1);

    SQLIB_CHECK(os.str() == "select 3+5\n");

    db1.disable_trace();
    query1(1,2);

    SQLIB_CHECK(os.str() == "select 3+5\n");
  }

  // range test
  {
    database db1(":memory:");
    db1.execute_sql(table_def);

    std::vector<std::pair<int, string>> data =
      {{1, "first"}, {2, "second"}, {3, "third"}};

    statement insert1(db1, "insert into table1 (col1,col2) values(?1,?2)");
    for(const auto& row : data)
      insert1(row.first, row.second);

    decltype (data) result;

    query<int,string> query1(db1, "select col1,col2 from table1");
    for(const auto& row : query1())
      result.push_back({ std::get<0>(row), std::get<1>(row) });

    SQLIB_CHECK(data == result);
  }

  // dynquery test
  {
    database db1(":memory:");
    db1.execute_sql(table_def);

    std::vector<std::pair<int, string>> data =
      {{1, "first"}, {2, "second"}, {3, "third"}};

    statement insert1(db1, "insert into table1 (col1,col2) values(?1,?2)");
    for(const auto& row : data)
      insert1(row.first, row.second);

    decltype (data) result;

    dynquery query1(db1, "select col1,col2 from table1");
    for(auto row : query1()) {
      int col1;
      string col2;
      row.get(col1, col2);
      result.push_back({col1, col2});
    }

    SQLIB_CHECK(data == result);
  }

  return 0;
}